

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codim_mesh_data_set.h
# Opt level: O0

double * __thiscall
lf::mesh::utils::CodimMeshDataSet<double>::operator()(CodimMeshDataSet<double> *this,Entity *e)

{
  uint uVar1;
  element_type *peVar2;
  const_reference pdVar3;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Entity *local_18;
  Entity *e_local;
  CodimMeshDataSet<double> *this_local;
  
  local_18 = e;
  e_local = (Entity *)this;
  uVar1 = (*(this->super_MeshDataSet<double>)._vptr_MeshDataSet[1])(this,e);
  if ((uVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"MeshDataSet not defined on this entity.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"DefinedOn(e)",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/codim_mesh_data_set.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x4b,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/codim_mesh_data_set.h"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x4b,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  peVar2 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_);
  uVar1 = (*peVar2->_vptr_Mesh[5])(peVar2,local_18);
  pdVar3 = boost::container::vector<double,_void,_void>::operator[](&this->data_,(ulong)uVar1);
  return pdVar3;
}

Assistant:

[[nodiscard]] const T& operator()(const Entity& e) const override {
    LF_ASSERT_MSG(DefinedOn(e), "MeshDataSet not defined on this entity.");
    return data_[mesh_->Index(e)];
  }